

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O2

int Pdr_ManCheckCube(Pdr_Man_t *p,int k,Pdr_Set_t *pCube,Pdr_Set_t **ppPred,int nConfLimit)

{
  long lVar1;
  uint Entry;
  Pdr_Set_t **ppPVar2;
  int iVar3;
  sat_solver *s;
  Vec_Int_t *pVVar4;
  Aig_Obj_t *pObj;
  long lVar5;
  abctime aVar6;
  Pdr_Set_t *pPVar7;
  long lVar8;
  int *piVar9;
  int *begin;
  int Lit;
  int local_44;
  abctime local_40;
  Pdr_Set_t **local_38;
  
  p->nCalls = p->nCalls + 1;
  s = Pdr_ManFetchSolver(p,k);
  local_38 = ppPred;
  if (pCube == (Pdr_Set_t *)0x0) {
    local_40 = Abc_Clock();
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,p->iOutCur);
    iVar3 = Pdr_ObjSatVar(p,k,2,pObj);
    Lit = iVar3 * 2;
    lVar8 = p->timeToStop;
    lVar1 = p->timeToStopOne;
    lVar5 = lVar1;
    if (((lVar8 != 0) && (lVar5 = lVar8, lVar1 != 0)) && (lVar5 = lVar1, lVar8 < lVar1)) {
      lVar5 = lVar8;
    }
    aVar6 = s->nRuntimeLimit;
    s->nRuntimeLimit = lVar5;
    piVar9 = &local_44;
    begin = &Lit;
  }
  else {
    local_44 = nConfLimit;
    if ((k < 0) || (p->vActVars->nSize <= k)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
    }
    piVar9 = p->vActVars->pArray + (uint)k;
    *piVar9 = *piVar9 + 1;
    pVVar4 = Pdr_ManCubeToLits(p,k,pCube,1,0);
    iVar3 = Pdr_ManFreeVar(p,k);
    Entry = iVar3 * 2;
    Lit = Entry;
    Vec_IntPush(pVVar4,Entry);
    iVar3 = sat_solver_addclause(s,pVVar4->pArray,pVVar4->pArray + pVVar4->nSize);
    if (iVar3 != 1) {
      __assert_fail("RetValue == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrSat.c"
                    ,0x13f,"int Pdr_ManCheckCube(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, int)")
      ;
    }
    sat_solver_compress(s);
    pVVar4 = Pdr_ManCubeToLits(p,k,pCube,0,1);
    Vec_IntPush(pVVar4,Entry | 1);
    local_40 = Abc_Clock();
    lVar8 = p->timeToStop;
    lVar1 = p->timeToStopOne;
    lVar5 = lVar1;
    if (((lVar8 != 0) && (lVar5 = lVar8, lVar1 != 0)) && (lVar5 = lVar1, lVar8 < lVar1)) {
      lVar5 = lVar8;
    }
    aVar6 = s->nRuntimeLimit;
    s->nRuntimeLimit = lVar5;
    begin = pVVar4->pArray;
    piVar9 = begin + pVVar4->nSize;
    nConfLimit = local_44;
  }
  iVar3 = sat_solver_solve(s,begin,piVar9,(long)nConfLimit,0,0,0);
  s->nRuntimeLimit = aVar6;
  if (iVar3 == 0) {
    iVar3 = -1;
  }
  else {
    aVar6 = Abc_Clock();
    ppPVar2 = local_38;
    lVar8 = aVar6 - local_40;
    p->tSat = p->tSat + lVar8;
    if (iVar3 == -1) {
      iVar3 = 1;
      p->tSatUnsat = p->tSatUnsat + lVar8;
      p->nCallsU = p->nCallsU + 1;
      if (local_38 == (Pdr_Set_t **)0x0) {
        return 1;
      }
      pPVar7 = (Pdr_Set_t *)0x0;
    }
    else {
      p->tSatSat = p->tSatSat + lVar8;
      p->nCallsS = p->nCallsS + 1;
      if (local_38 == (Pdr_Set_t **)0x0) {
        return 0;
      }
      pPVar7 = Pdr_ManTernarySim(p,k,pCube);
      iVar3 = 0;
    }
    *ppPVar2 = pPVar7;
  }
  return iVar3;
}

Assistant:

int Pdr_ManCheckCube( Pdr_Man_t * p, int k, Pdr_Set_t * pCube, Pdr_Set_t ** ppPred, int nConfLimit )
{ 
    int fUseLit = 1;
    int fLitUsed = 0;
    sat_solver * pSat;
    Vec_Int_t * vLits;
    int Lit, RetValue;
    abctime clk, Limit;
    p->nCalls++;
    pSat = Pdr_ManFetchSolver( p, k );
    if ( pCube == NULL ) // solve the property
    {
        clk = Abc_Clock();
        Lit = toLit( Pdr_ObjSatVar(p, k, 2, Aig_ManCo(p->pAig, p->iOutCur)) ); // pos literal (property fails)
        Limit = sat_solver_set_runtime_limit( pSat, Pdr_ManTimeLimit(p) );
        RetValue = sat_solver_solve( pSat, &Lit, &Lit + 1, nConfLimit, 0, 0, 0 );
        sat_solver_set_runtime_limit( pSat, Limit );
        if ( RetValue == l_Undef )
            return -1;
    }
    else // check relative containment in terms of next states
    {
        if ( fUseLit )
        {
            fLitUsed = 1;
            Vec_IntAddToEntry( p->vActVars, k, 1 );
            // add the cube in terms of current state variables
            vLits = Pdr_ManCubeToLits( p, k, pCube, 1, 0 );
            // add activation literal
            Lit = toLit( Pdr_ManFreeVar(p, k) );
            // add activation literal
            Vec_IntPush( vLits, Lit );
            RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
            assert( RetValue == 1 );
            sat_solver_compress( pSat );
            // create assumptions
            vLits = Pdr_ManCubeToLits( p, k, pCube, 0, 1 );
            // add activation literal
            Vec_IntPush( vLits, lit_neg(Lit) );
        }
        else
            vLits = Pdr_ManCubeToLits( p, k, pCube, 0, 1 );

        // solve 
        clk = Abc_Clock();
        Limit = sat_solver_set_runtime_limit( pSat, Pdr_ManTimeLimit(p) );
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), nConfLimit, 0, 0, 0 );
        sat_solver_set_runtime_limit( pSat, Limit );
        if ( RetValue == l_Undef )
            return -1;
/*
        if ( RetValue == l_True )
        {
            int RetValue2 = Pdr_ManCubeJust( p, k, pCube );
            if ( RetValue2 )
                p->nCasesSS++;
            else
                p->nCasesSU++;
        }
        else
        {
            int RetValue2 = Pdr_ManCubeJust( p, k, pCube );
            if ( RetValue2 )
                p->nCasesUS++;
            else
                p->nCasesUU++;
        }
*/
    }
    clk = Abc_Clock() - clk;
    p->tSat += clk;
    assert( RetValue != l_Undef );
    if ( RetValue == l_False )
    {
        p->tSatUnsat += clk;
        p->nCallsU++;
        if ( ppPred )
            *ppPred = NULL;
        RetValue = 1;
    }
    else // if ( RetValue == l_True )
    {
        p->tSatSat += clk;
        p->nCallsS++;
        if ( ppPred )
            *ppPred = Pdr_ManTernarySim( p, k, pCube );
        RetValue = 0;
    }

/* // for some reason, it does not work...
    if ( fLitUsed )
    {
        int RetValue;
        Lit = lit_neg(Lit);
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
        assert( RetValue == 1 );
        sat_solver_compress( pSat );
    }
*/
    return RetValue;
}